

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.h
# Opt level: O2

void __thiscall sznet::Timer::Timer(Timer *this,TimerCallback *cb,Timestamp when,double interval)

{
  long lVar1;
  
  (this->super_MinHeaBaseElem).min_heap_idx = -1;
  std::function<void_()>::function(&this->m_callback,cb);
  (this->m_expiration).m_microSecondsSinceEpoch = when.m_microSecondsSinceEpoch;
  this->m_interval = interval;
  this->m_repeat = 0.0 < interval;
  LOCK();
  UNLOCK();
  lVar1 = m_s_numCreated + 1;
  this->m_sequence = m_s_numCreated;
  m_s_numCreated = lVar1;
  return;
}

Assistant:

Timer(net::TimerCallback cb, Timestamp when, double interval): 
		m_callback(std::move(cb)),
		m_expiration(when),
		m_interval(interval),
		m_repeat(interval > 0.0),
		m_sequence(m_s_numCreated++)
	{ 
	}